

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O1

void __thiscall FlowGraph::AddBlockToLoop(FlowGraph *this,BasicBlock *block,Loop *loop)

{
  RealCount *pRVar1;
  Type pSVar2;
  
  pSVar2 = (Type)new<Memory::ArenaAllocator>(0x10,(loop->blockList).allocator,0x366bee);
  pSVar2[1].next = (Type)block;
  pSVar2->next = (loop->blockList).super_SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>.
                 super_SListNodeBase<Memory::ArenaAllocator>.next;
  (loop->blockList).super_SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>.
  super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar2;
  pRVar1 = &(loop->blockList).super_SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>.
            super_RealCount;
  pRVar1->count = pRVar1->count + 1;
  if ((block->field_0x18 & 8) != 0) {
    Loop::SetHasCall(loop);
  }
  if ((block->field_0x18 & 0x10) == 0) {
    return;
  }
  Loop::SetHasYield(loop);
  return;
}

Assistant:

void
FlowGraph::AddBlockToLoop(BasicBlock *block, Loop *loop)
{
    loop->blockList.Prepend(block);
    if (block->hasCall)
    {
        loop->SetHasCall();
    }
    if (block->hasYield)
    {
        loop->SetHasYield();
    }
}